

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O0

void __thiscall SerializeSpan_Write_Test::TestBody(SerializeSpan_Write_Test *this)

{
  MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  *this_00;
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  *pTVar1;
  MockSpec<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  *this_01;
  TypedExpectation<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  *this_02;
  char *pcVar2;
  span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L> sp;
  mock_span_archive *pmStack_180;
  span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L> span;
  array<(anonymous_namespace)::SerializeSpan::simple_struct,_2UL> my;
  MockSpec<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  local_148;
  ReturnAction<pstore::serialize::archive::void_type> local_120;
  Action<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  local_110;
  WithoutMatchers local_ed [13];
  Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_> local_e0;
  MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  local_c8;
  undefined1 local_a1;
  undefined1 local_a0 [7];
  void_type ret;
  mock_span_archive arch;
  SerializeSpan_Write_Test *this_local;
  
  anon_unknown.dwarf_54ed9::SerializeSpan::mock_span_archive::mock_span_archive
            ((mock_span_archive *)local_a0);
  local_a1 = 0;
  testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,-1l>>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_1l>> *)
             &local_e0,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_54ed9::SerializeSpan::mock_span_archive::gmock_writen
            (&local_c8,(mock_span_archive *)local_a0,&local_e0);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
            ::operator()(&local_c8,local_ed,(void *)0x0);
  pTVar1 = testing::internal::
           MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
           ::InternalExpectedAt
                     (this_00,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                      ,0xc0,"arch","writen (_)");
  pTVar1 = testing::internal::
           TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
           ::Times(pTVar1,1);
  testing::Return<pstore::serialize::archive::void_type>(&local_120);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_110,(ReturnAction *)&local_120);
  testing::internal::
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
  ::WillOnce(pTVar1,&local_110);
  testing::
  Action<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
  ::~Action(&local_110);
  testing::internal::ReturnAction<pstore::serialize::archive::void_type>::~ReturnAction(&local_120);
  testing::internal::
  MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
  ::~MockSpec(&local_c8);
  testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>_>::
  ~Matcher(&local_e0);
  testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,-1l>>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_1l>> *)
             (my._M_elems + 1),(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_54ed9::SerializeSpan::mock_span_archive::gmock_readn
            (&local_148,(mock_span_archive *)local_a0,
             (Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
              *)(my._M_elems + 1));
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
            ::operator()(&local_148,(WithoutMatchers *)((long)&my._M_elems[0].a + 3),(void *)0x0);
  pcVar2 = "arch";
  this_02 = testing::internal::
            MockSpec<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
            ::InternalExpectedAt
                      (this_01,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                       ,0xc1,"arch","readn (_)");
  testing::internal::
  TypedExpectation<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
  ::Times(this_02,0);
  testing::internal::
  MockSpec<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>::
  ~MockSpec(&local_148);
  testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>_>::
  ~Matcher((Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_> *)
           (my._M_elems + 1));
  pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,-1l>::
  span<2ul,(anonymous_namespace)::SerializeSpan::simple_struct>
            ((span<(anonymous_namespace)::SerializeSpan::simple_struct,_1l> *)&pmStack_180,
             (array<(anonymous_namespace)::SerializeSpan::simple_struct,_2UL> *)
             ((long)&span.storage_.data_ + 4));
  sp.storage_.data_ = (pointer)pcVar2;
  sp.storage_.super_extent_type<_1L>.size_ = span.storage_.super_extent_type<_1L>.size_;
  pstore::serialize::
  write<(anonymous_namespace)::SerializeSpan::mock_span_archive&,(anonymous_namespace)::SerializeSpan::simple_struct,_1l>
            ((serialize *)local_a0,pmStack_180,sp);
  anon_unknown.dwarf_54ed9::SerializeSpan::mock_span_archive::~mock_span_archive
            ((mock_span_archive *)local_a0);
  return;
}

Assistant:

TEST_F (SerializeSpan, Write) {
    using ::testing::_;
    using ::testing::Return;

    SerializeSpan::mock_span_archive arch;

    auto const ret = pstore::serialize::archive::void_type{};
    EXPECT_CALL (arch, writen (_)).Times (1).WillOnce (Return (ret));
    EXPECT_CALL (arch, readn (_)).Times (0);

    std::array<simple_struct, 2> my;
    ::pstore::gsl::span<simple_struct> span{my};
    pstore::serialize::write (arch, span);
}